

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::MethodDescriptorProto::SharedCtor(MethodDescriptorProto *this)

{
  this->name_ = (string *)&internal::kEmptyString_abi_cxx11_;
  this->input_type_ = (string *)&internal::kEmptyString_abi_cxx11_;
  this->output_type_ = (string *)&internal::kEmptyString_abi_cxx11_;
  this->options_ = (MethodOptions *)0x0;
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  return;
}

Assistant:

void MethodDescriptorProto::SharedCtor() {
  _cached_size_ = 0;
  name_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  input_type_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  output_type_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  options_ = NULL;
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
}